

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_memory.c
# Opt level: O0

ssize_t memory_write(archive *a,void *client_data,void *buff,size_t length)

{
  size_t in_RCX;
  void *in_RDX;
  long *in_RSI;
  archive *in_RDI;
  write_memory_data *mine;
  size_t local_8;
  
  if ((ulong)in_RSI[1] < *in_RSI + in_RCX) {
    archive_set_error(in_RDI,0xc,"Buffer exhausted");
    local_8 = 0xffffffffffffffe2;
  }
  else {
    memcpy((void *)(in_RSI[3] + *in_RSI),in_RDX,in_RCX);
    *in_RSI = in_RCX + *in_RSI;
    local_8 = in_RCX;
    if (in_RSI[2] != 0) {
      *(long *)in_RSI[2] = *in_RSI;
    }
  }
  return local_8;
}

Assistant:

static ssize_t
memory_write(struct archive *a, void *client_data, const void *buff, size_t length)
{
	struct write_memory_data *mine;
	mine = client_data;

	if (mine->used + length > mine->size) {
		archive_set_error(a, ENOMEM, "Buffer exhausted");
		return (ARCHIVE_FATAL);
	}
	memcpy(mine->buff + mine->used, buff, length);
	mine->used += length;
	if (mine->client_size != NULL)
		*mine->client_size = mine->used;
	return (length);
}